

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iostream.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__lhs;
  bool bVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  istream *piVar6;
  bool local_d69;
  exception *e;
  string local_c10 [32];
  ostringstream local_bf0 [8];
  ostringstream ss_6;
  string local_a70 [32];
  ostringstream local_a50 [8];
  ostringstream ss_5;
  allocator<char> local_8d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  undefined1 local_8a9;
  string local_8a8 [32];
  ostringstream local_888 [8];
  ostringstream ss_4;
  string local_708 [32];
  ostringstream local_6e8 [8];
  ostringstream ss_3;
  string local_568 [32];
  ostringstream local_548 [8];
  ostringstream ss_2;
  char *local_3d0;
  char *s;
  string v2;
  string v1;
  string local_380 [32];
  ostringstream local_360 [8];
  ostringstream ss_1;
  int local_1e0;
  int c_1;
  int i_1;
  ostringstream local_1b8 [8];
  ostringstream ss;
  int local_28;
  char c;
  int i;
  int maxval;
  char *example;
  char **argv_local;
  int argc_local;
  
  for (local_28 = 0; local_28 < 15000; local_28 = local_28 + 1) {
    plVar3 = (long *)std::istream::putback('h');
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar4 = std::operator<<((ostream *)local_1b8,"Error nowide::cin.putback(c) in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x11);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,(string *)&i_1);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  for (local_1e0 = 14999; -1 < local_1e0; local_1e0 = local_1e0 + -1) {
    iVar2 = std::istream::get();
    if (iVar2 != local_1e0 % 0x60 + 0x20) {
      std::__cxx11::ostringstream::ostringstream(local_360);
      poVar4 = std::operator<<((ostream *)local_360,"Error nowide::cin.get() == c in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x15);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_380);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)(v2.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&s);
  poVar4 = std::operator<<((ostream *)&std::cout,"Normal I/O:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2140);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr,anon_var_dwarf_2140);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Flushing each character:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (local_3d0 = anon_var_dwarf_2140; *local_3d0 != '\0'; local_3d0 = local_3d0 + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,*local_3d0);
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)));
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_548);
      poVar4 = std::operator<<((ostream *)local_548,"Error nowide::cout in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x20);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_568);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_6e8);
    poVar4 = std::operator<<((ostream *)local_6e8,"Error nowide::cout in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x23);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_708);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&std::cerr + *(long *)(std::cerr + -0x18)));
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_888);
    poVar4 = std::operator<<((ostream *)local_888,"Error nowide::cerr in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x24);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    local_8a9 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_8a8);
    local_8a9 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_d69 = false;
  if (argc == 2) {
    __lhs = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"-i",&local_8d1);
    local_d69 = std::operator==(__lhs,&local_8d0);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::allocator<char>::~allocator(&local_8d1);
  }
  if (local_d69 != false) {
    piVar6 = std::operator>>((istream *)&std::cin,(string *)(v2.field_2._M_local_buf + 8));
    std::operator>>(piVar6,(string *)&s);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&std::cin + *(long *)(std::cin + -0x18)));
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_a50);
      poVar4 = std::operator<<((ostream *)local_a50,"Error nowide::cin in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x27);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_a70);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"First:  ");
    poVar4 = std::operator<<(poVar4,(string *)(v2.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Second: ");
    poVar4 = std::operator<<(poVar4,(string *)&s);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)));
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_bf0);
      poVar4 = std::operator<<((ostream *)local_bf0,"Error nowide::cout in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_iostream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2a);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_c10);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)(v2.field_2._M_local_buf + 8));
  poVar4 = std::operator<<((ostream *)&std::cout,"Ok");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc,char **argv)
{
    
    char const *example = "Basic letters: \xd7\xa9-\xd0\xbc-\xce\xbd\n"
                          "East Asian Letters: \xe5\x92\x8c\xe5\xb9\xb3\n"
                          "Non-BMP letters: \xf0\x9d\x84\x9e\n";

    try {
        int maxval = 15000;
        for(int i=0;i<maxval;i++) {
            char c = i % 96 + ' ';
            TEST(nowide::cin.putback(c));
        }
        for(int i=maxval-1;i>=0;i--) {
            int c = i % 96 + ' ';
            TEST(nowide::cin.get() == c);
        }
        std::string v1,v2;
        nowide::cout << "Normal I/O:" << std::endl;
        nowide::cout << example << std::endl;
        nowide::cerr << example << std::endl;
        
        nowide::cout << "Flushing each character:" << std::endl;
        
        for(char const *s=example;*s;s++) {
            nowide::cout << *s << std::flush;
            TEST(nowide::cout);
        }
        
        TEST(nowide::cout);
        TEST(nowide::cerr);
        if(argc==2 && argv[1]==std::string("-i")) {
            nowide::cin  >> v1 >> v2;
            TEST(nowide::cin);
            nowide::cout << "First:  "<< v1 << std::endl;
            nowide::cout << "Second: "<< v2 << std::endl;
            TEST(nowide::cout);
        }
    }
    catch(std::exception const &e) {
        std::cerr << "Fail: " << e.what() << std::endl;
        return 1;
    }
    std::cout <<"Ok" << std::endl;
    return 0;

}